

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O1

void __thiscall
ProblemTest_InvalidLogicalConIndex_Test::TestBody(ProblemTest_InvalidLogicalConIndex_Test *this)

{
  bool bVar1;
  LogicalConstant expr;
  int iVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  Problem p;
  AssertHelper local_3b0;
  AssertionResult local_3a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398 [2];
  long local_388 [2];
  BasicProblem<mp::BasicProblemParams<int>_> local_378;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem(&local_378);
  iVar2 = 3;
  do {
    expr = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                     (&local_378.super_ExprFactory,true);
    mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
              (&local_378,
               (LogicalExpr)
               expr.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.super_ExprBase.impl_);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  testing::AssertionSuccess();
  if (local_3a8.success_ == true) {
    local_398[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con(&local_378,-1);
    }
    testing::AssertionResult::operator<<
              (&local_3a8,
               (char (*) [103])
               "Expected: p.logical_con(-1) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_398[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388) {
      operator_delete(local_398[0].ptr_,local_388[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_398);
  if (local_3a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_3a8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x1c8,pcVar3);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)local_398);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  if (local_398[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_398[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_398[0].ptr_ + 8))();
    }
    local_398[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  testing::AssertionSuccess();
  if (local_3a8.success_ == true) {
    local_398[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"invalid index","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicProblem<mp::BasicProblemParams<int>_>::logical_con(&local_378,3);
    }
    testing::AssertionResult::operator<<
              (&local_3a8,
               (char (*) [109])
               "Expected: p.logical_con(num_cons) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_398[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_388) {
      operator_delete(local_398[0].ptr_,local_388[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_398);
  if (local_3a8.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_3a8.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_3b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/problem-test.cc",
             0x1c9,pcVar3);
  testing::internal::AssertHelper::operator=(&local_3b0,(Message *)local_398);
  testing::internal::AssertHelper::~AssertHelper(&local_3b0);
  if (local_398[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_398[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_398[0].ptr_ + 8))();
    }
    local_398[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_3a8.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(&local_378);
  return;
}

Assistant:

TEST(ProblemTest, InvalidLogicalConIndex) {
  Problem p;
  const int num_cons = 3;
  for (int i = 0; i < num_cons; ++i)
    p.AddCon(p.MakeLogicalConstant(true));
  EXPECT_ASSERT(p.logical_con(-1), "invalid index");
  EXPECT_ASSERT(p.logical_con(num_cons), "invalid index");
}